

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool CountHighbitsCollisions<Blob<160>>
               (vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes,int nbHBits)

{
  pointer pBVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Blob<160> h2;
  Blob<160> h1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  bVar3 = true;
  if (nbHBits < 0xa0) {
    uVar6 = ((long)(hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    auVar11._0_8_ = (double)(int)uVar6;
    dVar9 = ldexp(1.0,nbHBits);
    auVar10._0_8_ = (auVar11._0_8_ * (double)((int)uVar6 + -1)) / dVar9;
    auVar10._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar10 = vminsd_avx(auVar11,auVar10);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbHBits);
    uVar7 = 0;
    if (1 < uVar6) {
      uVar7 = 0;
      uVar8 = 1;
      do {
        pBVar1 = (hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_38 = *(undefined4 *)(pBVar1[uVar8 - 1].bytes + 0x10);
        pBVar1 = pBVar1 + (uVar8 - 1);
        local_48 = *(undefined8 *)pBVar1->bytes;
        uStack_40 = *(undefined8 *)(pBVar1->bytes + 8);
        rshift32(&local_48,0x14,0xa0 - nbHBits);
        pBVar1 = (hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_58 = *(undefined4 *)(pBVar1[uVar8].bytes + 0x10);
        pBVar1 = pBVar1 + uVar8;
        local_68 = *(undefined8 *)pBVar1->bytes;
        uStack_60 = *(undefined8 *)(pBVar1->bytes + 8);
        rshift32(&local_68,0x14,0xa0 - nbHBits);
        uVar4 = 0;
        if ((char)local_48 == (char)local_68) {
          uVar2 = 0;
          do {
            uVar5 = uVar2;
            if (uVar5 == 0x13) break;
            uVar2 = uVar5 + 1;
          } while (*(char *)((long)&local_48 + uVar5 + 1) == *(char *)((long)&local_68 + uVar5 + 1))
          ;
          uVar4 = (uint)(0x12 < uVar5);
        }
        uVar7 = uVar7 + uVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
    }
    dVar9 = (double)(int)uVar7 / auVar10._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar7);
    if ((0.98 < dVar9) && (uVar7 = uVar7 - (int)auVar10._0_8_, uVar7 != 0)) {
      printf(" (%i)",(ulong)uVar7);
    }
    if (2.0 < dVar9) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar3 = 2.0 >= dVar9;
  }
  return bVar3;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = hashes[hnb-1];
    hashtype const h2x = hashes[hnb];
#endif
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}